

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O3

void duckdb::SerializeVersionNumber(WriteStream *ser,string *version_str)

{
  ulong __n;
  data_t version [32];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  __n = version_str->_M_string_length;
  if (0x1f < __n) {
    __n = 0x20;
  }
  switchD_00b03519::default(&local_38,(version_str->_M_dataplus)._M_p,__n);
  (**ser->_vptr_WriteStream)(ser,&local_38,0x20);
  return;
}

Assistant:

void SerializeVersionNumber(WriteStream &ser, const string &version_str) {
	data_t version[MainHeader::MAX_VERSION_SIZE];
	memset(version, 0, MainHeader::MAX_VERSION_SIZE);
	memcpy(version, version_str.c_str(), MinValue<idx_t>(version_str.size(), MainHeader::MAX_VERSION_SIZE));
	ser.WriteData(version, MainHeader::MAX_VERSION_SIZE);
}